

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckTable(TidyDocImpl *doc,Node *node)

{
  Node *node_00;
  bool bVar1;
  Bool BVar2;
  uint uVar3;
  ctmbstr ptVar4;
  bool bVar5;
  AttVal *local_48;
  AttVal *av;
  Bool HasCaption;
  Bool HasSummary;
  int numTR;
  tmbstr word;
  Node *temp;
  Node *TNode;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  _HasSummary = (ctmbstr)0x0;
  HasCaption = no;
  bVar1 = false;
  bVar5 = false;
  BVar2 = Level3_Enabled(doc);
  if (BVar2 != no) {
    for (local_48 = node->attributes; local_48 != (AttVal *)0x0; local_48 = local_48->next) {
      if (((local_48 != (AttVal *)0x0) && (local_48->dict != (Attribute *)0x0)) &&
         (local_48->dict->id == TidyAttr_SUMMARY)) {
        BVar2 = hasValue(local_48);
        if ((((BVar2 != no) && (bVar1 = true, local_48 != (AttVal *)0x0)) &&
            ((local_48->value != (tmbstr)0x0 &&
             ((ptVar4 = prvTidytmbsubstr(local_48->value,"summary"), ptVar4 != (ctmbstr)0x0 &&
              (local_48 != (AttVal *)0x0)))))) &&
           ((local_48->value != (tmbstr)0x0 &&
            (ptVar4 = prvTidytmbsubstr(local_48->value,"table"), ptVar4 != (ctmbstr)0x0)))) {
          prvTidyReportAccessError(doc,node,0x2cc);
        }
        if ((local_48->value == (tmbstr)0x0) ||
           (uVar3 = prvTidytmbstrlen(local_48->value), uVar3 == 0)) {
          bVar1 = true;
          prvTidyReportAccessError(doc,node,0x2ca);
        }
        else {
          BVar2 = IsWhitespace(local_48->value);
          if ((BVar2 != no) && (uVar3 = prvTidytmbstrlen(local_48->value), uVar3 != 0)) {
            bVar1 = true;
            prvTidyReportAccessError(doc,node,0x2cb);
          }
        }
      }
    }
    if (node->content == (Node *)0x0) {
      prvTidyReportAccessError(doc,node,0x2c2);
      return;
    }
  }
  BVar2 = Level1_Enabled(doc);
  if (BVar2 != no) {
    CheckMultiHeaders(doc,node);
  }
  BVar2 = Level2_Enabled(doc);
  if (BVar2 != no) {
    if (((node->content != (Node *)0x0) && (node->content->tag != (Dict *)0x0)) &&
       (node->content->tag->id == TidyTag_CAPTION)) {
      node_00 = node->content;
      if ((node_00->content != (Node *)0x0) && (node_00->content->tag == (Dict *)0x0)) {
        _HasSummary = getTextNodeClear(doc,node_00);
      }
      BVar2 = IsWhitespace(_HasSummary);
      bVar5 = BVar2 == no;
    }
    if (!bVar5) {
      prvTidyReportAccessError(doc,node,0x2cd);
    }
  }
  if (node->content != (Node *)0x0) {
    if (((node->content == (Node *)0x0) || (node->content->tag == (Dict *)0x0)) ||
       ((node->content->tag->id != TidyTag_CAPTION ||
        (((node->content->next == (Node *)0x0 || (node->content->next->tag == (Dict *)0x0)) ||
         (node->content->next->tag->id != TidyTag_TR)))))) {
      if (((node->content != (Node *)0x0) && (node->content->tag != (Dict *)0x0)) &&
         (node->content->tag->id == TidyTag_TR)) {
        CheckColumns(doc,node->content);
      }
    }
    else {
      CheckColumns(doc,node->content->next);
    }
  }
  if (((doc->access).HasValidColumnHeaders == no) && (node->content != (Node *)0x0)) {
    if ((node->content == (Node *)0x0) ||
       ((((node->content->tag == (Dict *)0x0 || (node->content->tag->id != TidyTag_CAPTION)) ||
         (node->content->next == (Node *)0x0)) ||
        ((node->content->next->tag == (Dict *)0x0 || (node->content->next->tag->id != TidyTag_TR))))
       )) {
      if ((node->content != (Node *)0x0) &&
         ((node->content->tag != (Dict *)0x0 && (node->content->tag->id == TidyTag_TR)))) {
        CheckRows(doc,node->content);
      }
    }
    else {
      CheckRows(doc,node->content->next);
    }
  }
  BVar2 = Level3_Enabled(doc);
  if ((BVar2 != no) && (!bVar1)) {
    prvTidyReportAccessError(doc,node,0x2c9);
  }
  BVar2 = Level2_Enabled(doc);
  if (BVar2 != no) {
    if (node->content != (Node *)0x0) {
      for (word = (tmbstr)node->content; word != (tmbstr)0x0; word = *(tmbstr *)(word + 0x10)) {
        if (((word != (tmbstr)0x0) && (*(long *)(word + 0x38) != 0)) &&
           (**(int **)(word + 0x38) == 0x73)) {
          HasCaption = HasCaption + yes;
        }
      }
      if (HasCaption == yes) {
        prvTidyReportAccessError(doc,node,0x2c7);
      }
    }
    if ((doc->access).HasTH != no) {
      prvTidyReportAccessError(doc,node,0x2c8);
    }
  }
  BVar2 = Level1_Enabled(doc);
  if ((BVar2 != no) && ((doc->access).CheckedHeaders == 2)) {
    if ((((doc->access).HasValidRowHeaders == no) &&
        (((doc->access).HasValidColumnHeaders == no && ((doc->access).HasInvalidRowHeader == no))))
       && ((doc->access).HasInvalidColumnHeader == no)) {
      prvTidyReportAccessError(doc,node,0x2c2);
    }
    if (((doc->access).HasValidRowHeaders == no) && ((doc->access).HasInvalidRowHeader != no)) {
      prvTidyReportAccessError(doc,node,0x2c4);
    }
    if (((doc->access).HasValidColumnHeaders == no) && ((doc->access).HasInvalidColumnHeader != no))
    {
      prvTidyReportAccessError(doc,node,0x2c3);
    }
  }
  return;
}

Assistant:

static void CheckTable( TidyDocImpl* doc, Node* node )
{
    Node* TNode;
    Node* temp;

    tmbstr word = NULL;

    int numTR = 0;

    Bool HasSummary = no;
    Bool HasCaption = no;

    if (Level3_Enabled( doc ))
    {
        AttVal* av;
        /* Table must have a 'SUMMARY' describing the purpose of the table */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            if ( attrIsSUMMARY(av) )
            {
                if ( hasValue(av) )
                {
                    HasSummary = yes;

                    if (AttrContains(av, "summary") && 
                        AttrContains(av, "table"))
                    {
                        TY_(ReportAccessError)( doc, node, TABLE_SUMMARY_INVALID_PLACEHOLDER );
                    }
                }

                if ( av->value == NULL || TY_(tmbstrlen)(av->value) == 0 )
                {
                    HasSummary = yes;
                    TY_(ReportAccessError)( doc, node, TABLE_SUMMARY_INVALID_NULL );
                }
                else if ( IsWhitespace(av->value) && TY_(tmbstrlen)(av->value) > 0 )
                {
                    HasSummary = yes;
                    TY_(ReportAccessError)( doc, node, TABLE_SUMMARY_INVALID_SPACES );
                }
            }
        }

        /* TABLE must have content. */
        if (node->content == NULL)
        {
            TY_(ReportAccessError)( doc, node, DATA_TABLE_MISSING_HEADERS);
        
            return;
        }
    }

    if (Level1_Enabled( doc ))
    {
        /* Checks for multiple headers */
        CheckMultiHeaders( doc, node );
    }
    
    if (Level2_Enabled( doc ))
    {
        /* Table must have a CAPTION describing the purpose of the table */
        if ( nodeIsCAPTION(node->content) )
        {
            TNode = node->content;

            if (TNode->content && TNode->content->tag == NULL)
            {
                word = getTextNodeClear( doc, TNode);
            }

            if ( !IsWhitespace(word) )
            {
                HasCaption = yes;
            }
        }

        if (HasCaption == no)
        {
            TY_(ReportAccessError)( doc, node, TABLE_MISSING_CAPTION);
        }
    }

    
    if (node->content != NULL)
    {
        if ( nodeIsCAPTION(node->content) && nodeIsTR(node->content->next) )
        {
            CheckColumns( doc, node->content->next );
        }
        else if ( nodeIsTR(node->content) )
        {
            CheckColumns( doc, node->content );
        }
    }
    
    if ( ! doc->access.HasValidColumnHeaders )
    {
        if (node->content != NULL)
        {
            if ( nodeIsCAPTION(node->content) && nodeIsTR(node->content->next) )
            {
                CheckRows( doc, node->content->next);
            }
            else if ( nodeIsTR(node->content) )
            {
                CheckRows( doc, node->content);
            }
        }
    }
    
    
    if (Level3_Enabled( doc ))
    {
        /* Suppress warning for missing 'SUMMARY for HTML 2.0 and HTML 3.2 */
        if (HasSummary == no)
        {
            TY_(ReportAccessError)( doc, node, TABLE_MISSING_SUMMARY);
        }
    }

    if (Level2_Enabled( doc ))
    {
        if (node->content != NULL)
        {
            temp = node->content;

            while (temp != NULL)
            {
                if ( nodeIsTR(temp) )
                {
                    numTR++;
                }

                temp = temp->next;
            }

            if (numTR == 1)
            {
                TY_(ReportAccessError)( doc, node, LAYOUT_TABLES_LINEARIZE_PROPERLY);
            }
        }
    
        if ( doc->access.HasTH )
        {
            TY_(ReportAccessError)( doc, node, LAYOUT_TABLE_INVALID_MARKUP);
        }
    }

    if (Level1_Enabled( doc ))
    {
        if ( doc->access.CheckedHeaders == 2 )
        {
            if ( !doc->access.HasValidRowHeaders &&
                 !doc->access.HasValidColumnHeaders &&
                 !doc->access.HasInvalidRowHeader &&
                 !doc->access.HasInvalidColumnHeader  )
            {
                TY_(ReportAccessError)( doc, node, DATA_TABLE_MISSING_HEADERS);
            }

            if ( !doc->access.HasValidRowHeaders && 
                 doc->access.HasInvalidRowHeader )
            {
                TY_(ReportAccessError)( doc, node, DATA_TABLE_MISSING_HEADERS_ROW);
            }

            if ( !doc->access.HasValidColumnHeaders &&
                 doc->access.HasInvalidColumnHeader )
            {
                TY_(ReportAccessError)( doc, node, DATA_TABLE_MISSING_HEADERS_COLUMN);
            }
        }
    }
}